

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

uniformMatrixNfv
gl4cts::GLSL420Pack::Utils::getUniformMatrixNfv(Functions *gl,GLuint n_columns,GLuint n_rows)

{
  TestError *pTVar1;
  uniformMatrixNfv local_20;
  uniformMatrixNfv result;
  GLuint n_rows_local;
  GLuint n_columns_local;
  Functions *gl_local;
  
  if (n_columns == 2) {
    if (n_rows == 2) {
      local_20 = gl->uniformMatrix2fv;
    }
    else if (n_rows == 3) {
      local_20 = gl->uniformMatrix2x3fv;
    }
    else {
      if (n_rows != 4) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Invalid number of rows",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x389);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_20 = gl->uniformMatrix2x4fv;
    }
  }
  else if (n_columns == 3) {
    if (n_rows == 2) {
      local_20 = gl->uniformMatrix3x2fv;
    }
    else if (n_rows == 3) {
      local_20 = gl->uniformMatrix3fv;
    }
    else {
      if (n_rows != 4) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Invalid number of rows",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x399);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_20 = gl->uniformMatrix3x4fv;
    }
  }
  else {
    if (n_columns != 4) {
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid number of columns",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x3ad);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (n_rows == 2) {
      local_20 = gl->uniformMatrix4x2fv;
    }
    else if (n_rows == 3) {
      local_20 = gl->uniformMatrix4x3fv;
    }
    else {
      if (n_rows != 4) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Invalid number of rows",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x3a9);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_20 = gl->uniformMatrix4fv;
    }
  }
  return local_20;
}

Assistant:

Utils::uniformMatrixNfv Utils::getUniformMatrixNfv(const glw::Functions& gl, glw::GLuint n_columns, glw::GLuint n_rows)
{
	uniformMatrixNfv result = 0;

	switch (n_columns)
	{
	case 2:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix2fv;
			break;
		case 3:
			result = gl.uniformMatrix2x3fv;
			break;
		case 4:
			result = gl.uniformMatrix2x4fv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	case 3:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix3x2fv;
			break;
		case 3:
			result = gl.uniformMatrix3fv;
			break;
		case 4:
			result = gl.uniformMatrix3x4fv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	case 4:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix4x2fv;
			break;
		case 3:
			result = gl.uniformMatrix4x3fv;
			break;
		case 4:
			result = gl.uniformMatrix4fv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	default:
		TCU_FAIL("Invalid number of columns");
	}

	return result;
}